

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O2

bool caffe::NetNeedsBatchNormUpgrade(NetParameter *net_param)

{
  int iVar1;
  bool bVar2;
  Type *pTVar3;
  int i;
  int index;
  
  for (index = 0; iVar1 = (net_param->layer_).super_RepeatedPtrFieldBase.current_size_,
      index < iVar1; index = index + 1) {
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                       (&(net_param->layer_).super_RepeatedPtrFieldBase,index);
    bVar2 = std::operator==((pTVar3->type_).ptr_,"BatchNorm");
    if (bVar2) {
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                         (&(net_param->layer_).super_RepeatedPtrFieldBase,index);
      if ((pTVar3->param_).super_RepeatedPtrFieldBase.current_size_ == 3) break;
    }
  }
  return index < iVar1;
}

Assistant:

bool NetNeedsBatchNormUpgrade(const NetParameter& net_param) {
  for (int i = 0; i < net_param.layer_size(); ++i) {
    // Check if BatchNorm layers declare three parameters, as required by
    // the previous BatchNorm layer definition.
    if (net_param.layer(i).type() == "BatchNorm"
        && net_param.layer(i).param_size() == 3) {
      return true;
    }
  }
  return false;
}